

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::ResultBuilder::allowThrows(ResultBuilder *this)

{
  undefined1 uVar1;
  IMutableContext *pIVar2;
  long *local_10;
  
  pIVar2 = getCurrentMutableContext();
  (*(pIVar2->super_IContext)._vptr_IContext[6])(&local_10,pIVar2);
  uVar1 = (**(code **)(*local_10 + 0x20))();
  if (local_10 != (long *)0x0) {
    (**(code **)(*local_10 + 0x18))();
  }
  return (bool)uVar1;
}

Assistant:

IContext& getCurrentContext() {
        return getCurrentMutableContext();
    }